

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O1

char * fio_sha2_result(fio_sha2_s *s)

{
  uint uVar1;
  fio_sha2_variant_e fVar2;
  ulong uVar3;
  uint uVar4;
  uint_fast64_t tmp;
  ulong uVar5;
  ulong uVar6;
  size_t __n;
  uint8_t *__src;
  uint8_t *data;
  
  uVar4 = (uint)(s->length).words[0];
  if ((s->type & SHA_512) == 0) {
    uVar4 = uVar4 & 0x3f;
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x38) {
      if (uVar4 == 0x37) {
        s->buffer[0x37] = 0x80;
      }
      else {
        memcpy(s->buffer + uVar5,sha2_padding,0x38 - uVar5);
      }
    }
    else {
      memcpy(s->buffer + uVar5,sha2_padding,0x40 - uVar5);
      fio_sha2_perform_all_rounds(s,s->buffer);
      s->buffer[0x20] = '\0';
      s->buffer[0x21] = '\0';
      s->buffer[0x22] = '\0';
      s->buffer[0x23] = '\0';
      s->buffer[0x24] = '\0';
      s->buffer[0x25] = '\0';
      s->buffer[0x26] = '\0';
      s->buffer[0x27] = '\0';
      s->buffer[0x28] = '\0';
      s->buffer[0x29] = '\0';
      s->buffer[0x2a] = '\0';
      s->buffer[0x2b] = '\0';
      s->buffer[0x2c] = '\0';
      s->buffer[0x2d] = '\0';
      s->buffer[0x2e] = '\0';
      s->buffer[0x2f] = '\0';
      s->buffer[0x10] = '\0';
      s->buffer[0x11] = '\0';
      s->buffer[0x12] = '\0';
      s->buffer[0x13] = '\0';
      s->buffer[0x14] = '\0';
      s->buffer[0x15] = '\0';
      s->buffer[0x16] = '\0';
      s->buffer[0x17] = '\0';
      s->buffer[0x18] = '\0';
      s->buffer[0x19] = '\0';
      s->buffer[0x1a] = '\0';
      s->buffer[0x1b] = '\0';
      s->buffer[0x1c] = '\0';
      s->buffer[0x1d] = '\0';
      s->buffer[0x1e] = '\0';
      s->buffer[0x1f] = '\0';
      s->buffer[0] = '\0';
      s->buffer[1] = '\0';
      s->buffer[2] = '\0';
      s->buffer[3] = '\0';
      s->buffer[4] = '\0';
      s->buffer[5] = '\0';
      s->buffer[6] = '\0';
      s->buffer[7] = '\0';
      s->buffer[8] = '\0';
      s->buffer[9] = '\0';
      s->buffer[10] = '\0';
      s->buffer[0xb] = '\0';
      s->buffer[0xc] = '\0';
      s->buffer[0xd] = '\0';
      s->buffer[0xe] = '\0';
      s->buffer[0xf] = '\0';
      s->buffer[0x30] = '\0';
      s->buffer[0x31] = '\0';
      s->buffer[0x32] = '\0';
      s->buffer[0x33] = '\0';
      s->buffer[0x34] = '\0';
      s->buffer[0x35] = '\0';
      s->buffer[0x36] = '\0';
      s->buffer[0x37] = '\0';
    }
    uVar5 = (s->length).words[0] << 3;
    *(ulong *)(s->buffer + 0x38) =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | (s->length).words[0] << 0x3b;
    fio_sha2_perform_all_rounds(s,s->buffer);
    uVar4 = (s->digest).i32[0];
    uVar1 = (s->digest).i32[1];
    (s->digest).i32[0] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    (s->digest).i32[1] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    uVar4 = (s->digest).i32[2];
    (s->digest).i32[2] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar4 = (s->digest).i32[3];
    (s->digest).i32[3] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar4 = (s->digest).i32[4];
    (s->digest).i32[4] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar4 = (s->digest).i32[5];
    (s->digest).i32[5] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar4 = (s->digest).i32[6];
    (s->digest).i32[6] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    uVar4 = (s->digest).i32[7];
    (s->digest).i32[7] =
         uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    if (s->type != SHA_224) goto LAB_00139cea;
  }
  else {
    uVar4 = uVar4 & 0x7f;
    uVar5 = (ulong)uVar4;
    if (uVar5 < 0x70) {
      if (uVar4 != 0x6f) {
        data = s->buffer + uVar5;
        __n = 0x70 - uVar5;
        __src = sha2_padding;
        goto LAB_00139be8;
      }
      s->buffer[0x6f] = 0x80;
    }
    else {
      data = s->buffer;
      memcpy(s->buffer + uVar5,sha2_padding,0x80 - uVar5);
      fio_sha2_perform_all_rounds(s,data);
      __src = sha2_padding + 1;
      __n = 0x70;
LAB_00139be8:
      memcpy(data,__src,__n);
    }
    uVar5 = (s->length).words[0];
    uVar3 = (s->length).words[1] << 3;
    uVar6 = uVar5 << 3;
    uVar6 = uVar6 >> 0x38 | (uVar6 & 0xff000000000000) >> 0x28 | (uVar6 & 0xff0000000000) >> 0x18 |
            (uVar6 & 0xff00000000) >> 8 | (uVar6 & 0xff000000) << 8 | (uVar6 & 0xff0000) << 0x18 |
            (uVar6 & 0xff00) << 0x28 | uVar5 << 0x3b;
    uVar5 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
            (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
            (uVar3 & 0xff00) << 0x28 | (uVar3 | uVar5 >> 0x3d) << 0x38;
    (s->length).words[0] = uVar5;
    (s->length).words[1] = uVar6;
    *(ulong *)(s->buffer + 0x70) = uVar5;
    *(ulong *)(s->buffer + 0x78) = uVar6;
    fio_sha2_perform_all_rounds(s,s->buffer);
    uVar5 = (s->digest).i64[0];
    uVar3 = (s->digest).i64[1];
    (s->digest).i64[0] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    (s->digest).i64[1] =
         uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
         (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
         (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
    uVar5 = (s->digest).i64[2];
    (s->digest).i64[2] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    uVar5 = (s->digest).i64[3];
    (s->digest).i64[3] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    uVar5 = (s->digest).i64[4];
    (s->digest).i64[4] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    uVar5 = (s->digest).i64[5];
    (s->digest).i64[5] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    uVar5 = (s->digest).i64[6];
    (s->digest).i64[6] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    uVar5 = (s->digest).i64[7];
    (s->digest).i64[7] =
         uVar5 >> 0x38 | (uVar5 & 0xff000000000000) >> 0x28 | (uVar5 & 0xff0000000000) >> 0x18 |
         (uVar5 & 0xff00000000) >> 8 | (uVar5 & 0xff000000) << 8 | (uVar5 & 0xff0000) << 0x18 |
         (uVar5 & 0xff00) << 0x28 | uVar5 << 0x38;
    fVar2 = s->type;
    if (fVar2 == SHA_512_256) {
      (s->digest).str[0x20] = '\0';
      goto LAB_00139cea;
    }
    if (fVar2 == SHA_384) {
      (s->digest).str[0x30] = '\0';
      goto LAB_00139cea;
    }
    if (fVar2 != SHA_512_224) {
      (s->digest).str[0x40] = '\0';
      goto LAB_00139cea;
    }
  }
  (s->digest).str[0x1c] = '\0';
LAB_00139cea:
  return (char *)&s->digest;
}

Assistant:

char *fio_sha2_result(fio_sha2_s *s) {
  if (s->type & 1) {
    /* 512 bits derived hashing */

    size_t in_buffer = s->length.words[0] & 127;

    if (in_buffer > 111) {
      memcpy(s->buffer + in_buffer, sha2_padding, 128 - in_buffer);
      fio_sha2_perform_all_rounds(s, s->buffer);
      memcpy(s->buffer, sha2_padding + 1, 112);
    } else if (in_buffer != 111) {
      memcpy(s->buffer + in_buffer, sha2_padding, 112 - in_buffer);
    } else {
      s->buffer[111] = sha2_padding[0];
    }
    /* store the length in BITS - alignment should be promised by struct */
    /* this must the number in BITS, encoded as a BIG ENDIAN 64 bit number */

    s->length.words[1] = (s->length.words[1] << 3) | (s->length.words[0] >> 61);
    s->length.words[0] = s->length.words[0] << 3;
    s->length.words[0] = fio_lton64(s->length.words[0]);
    s->length.words[1] = fio_lton64(s->length.words[1]);

#if !__BIG_ENDIAN__
    {
      uint_fast64_t tmp = s->length.words[0];
      s->length.words[0] = s->length.words[1];
      s->length.words[1] = tmp;
    }
#endif

    uint64_t *len = (uint64_t *)(s->buffer + 112);
    len[0] = s->length.words[0];
    len[1] = s->length.words[1];
    fio_sha2_perform_all_rounds(s, s->buffer);

    /* change back to little endian */
    s->digest.i64[0] = fio_ntol64(s->digest.i64[0]);
    s->digest.i64[1] = fio_ntol64(s->digest.i64[1]);
    s->digest.i64[2] = fio_ntol64(s->digest.i64[2]);
    s->digest.i64[3] = fio_ntol64(s->digest.i64[3]);
    s->digest.i64[4] = fio_ntol64(s->digest.i64[4]);
    s->digest.i64[5] = fio_ntol64(s->digest.i64[5]);
    s->digest.i64[6] = fio_ntol64(s->digest.i64[6]);
    s->digest.i64[7] = fio_ntol64(s->digest.i64[7]);
    // set NULL bytes for SHA-2 Type
    switch (s->type) {
    case SHA_512_224:
      s->digest.str[28] = 0;
      break;
    case SHA_512_256:
      s->digest.str[32] = 0;
      break;
    case SHA_384:
      s->digest.str[48] = 0;
      break;
    default:
      s->digest.str[64] =
          0; /* sometimes the optimizer messes the NUL sequence */
      break;
    }
    // fprintf(stderr, "result requested, in hex, is:");
    // for (size_t i = 0; i < ((s->type & 1) ? 64 : 32); i++)
    //   fprintf(stderr, "%02x", (unsigned int)(s->digest.str[i] & 0xFF));
    // fprintf(stderr, "\r\n");
    return (char *)s->digest.str;
  }

  size_t in_buffer = s->length.words[0] & 63;
  if (in_buffer > 55) {
    memcpy(s->buffer + in_buffer, sha2_padding, 64 - in_buffer);
    fio_sha2_perform_all_rounds(s, s->buffer);
    memcpy(s->buffer, sha2_padding + 1, 56);
  } else if (in_buffer != 55) {
    memcpy(s->buffer + in_buffer, sha2_padding, 56 - in_buffer);
  } else {
    s->buffer[55] = sha2_padding[0];
  }
  /* store the length in BITS - alignment should be promised by struct */
  /* this must the number in BITS, encoded as a BIG ENDIAN 64 bit number */
  uint64_t *len = (uint64_t *)(s->buffer + 56);
  *len = s->length.words[0] << 3;
  *len = fio_lton64(*len);
  fio_sha2_perform_all_rounds(s, s->buffer);

  /* change back to little endian, if required */

  s->digest.i32[0] = fio_ntol32(s->digest.i32[0]);
  s->digest.i32[1] = fio_ntol32(s->digest.i32[1]);
  s->digest.i32[2] = fio_ntol32(s->digest.i32[2]);
  s->digest.i32[3] = fio_ntol32(s->digest.i32[3]);
  s->digest.i32[4] = fio_ntol32(s->digest.i32[4]);
  s->digest.i32[5] = fio_ntol32(s->digest.i32[5]);
  s->digest.i32[6] = fio_ntol32(s->digest.i32[6]);
  s->digest.i32[7] = fio_ntol32(s->digest.i32[7]);

  // set NULL bytes for SHA_224
  if (s->type == SHA_224)
    s->digest.str[28] = 0;
  // fprintf(stderr, "SHA-2 result requested, in hex, is:");
  // for (size_t i = 0; i < ((s->type & 1) ? 64 : 32); i++)
  //   fprintf(stderr, "%02x", (unsigned int)(s->digest.str[i] & 0xFF));
  // fprintf(stderr, "\r\n");
  return (char *)s->digest.str;
}